

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

UnaryFunctionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_unary(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xdc) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xdc;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    UnaryFunctionLayerParams::UnaryFunctionLayerParams(this_00.unary_);
    (this->layer_).unary_ = (UnaryFunctionLayerParams *)this_00;
  }
  return (UnaryFunctionLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::UnaryFunctionLayerParams* NeuralNetworkLayer::mutable_unary() {
  if (!has_unary()) {
    clear_layer();
    set_has_unary();
    layer_.unary_ = new ::CoreML::Specification::UnaryFunctionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.unary)
  return layer_.unary_;
}